

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

void __thiscall Jinx::Impl::Parser::ParseFunctionCall(Parser *this,FunctionMatch *match)

{
  pointer ptVar1;
  bool bVar2;
  unsigned_long uVar3;
  mapped_type *this_00;
  Symbol *pSVar4;
  Symbol *pSVar5;
  SymbolListCItr endSymbol;
  size_t i;
  ulong uVar6;
  RuntimeID local_78;
  String local_70;
  String libName;
  
  if (match->signature != (FunctionSignature *)0x0) {
    CheckLibraryName_abi_cxx11_(&libName,this);
    if (libName._M_string_length != 0) {
      pSVar4 = (this->m_currentSymbol)._M_current;
      this->m_lastLine = pSVar4->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar4 + 1;
    }
    for (uVar6 = 0;
        ptVar1 = (match->partData).
                 super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar6 < (ulong)(((long)(match->partData).
                               super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar1) / 0x18);
        uVar6 = uVar6 + 1) {
      if (ptVar1[uVar6].
          super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
          super__Head_base<0UL,_Jinx::Impl::FunctionSignaturePartType,_false>._M_head_impl == Name)
      {
        if (ptVar1[uVar6].
            super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>.
            super__Tuple_impl<1UL,_unsigned_long,_bool>.super__Head_base<1UL,_unsigned_long,_false>.
            _M_head_impl != 0) {
          pSVar4 = (this->m_currentSymbol)._M_current;
          this->m_lastLine = pSVar4->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar4 + 1;
        }
      }
      else {
        bVar2 = Accept(this,ParenOpen);
        if (bVar2) {
          ParseExpression(this);
          Expect(this,ParenClose,"Error parsing expression");
        }
        else {
          uVar3 = (match->partData).
                  super__Vector_base<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>,_Jinx::Allocator<std::tuple<Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].
                  super__Tuple_impl<0UL,_Jinx::Impl::FunctionSignaturePartType,_unsigned_long,_bool>
                  .super__Tuple_impl<1UL,_unsigned_long,_bool>.
                  super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
          pSVar4 = (this->m_currentSymbol)._M_current;
          pSVar5 = pSVar4 + uVar3;
          for (; (bVar2 = uVar3 != 0, uVar3 = uVar3 - 1, endSymbol._M_current = pSVar5, bVar2 &&
                 (endSymbol._M_current = pSVar4,
                 pSVar4 != (this->m_symbolList->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish)); pSVar4 = pSVar4 + 1) {
          }
          ParseExpression(this,endSymbol);
        }
      }
    }
    EmitOpcode(this,CallFunc);
    BinaryWriter::Write(&this->m_writer,match->signature->m_id);
    FunctionSignature::GetName_abi_cxx11_(&local_70,match->signature);
    local_78 = match->signature->m_id;
    this_00 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::less<unsigned_long>,_Jinx::StaticAllocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_8192UL,_16UL>_>
              ::operator[](&this->m_idNameMap,&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator=
              (this_00,&local_70);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&local_70);
    ParseSubscriptGet(this);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
              (&libName);
    return;
  }
  __assert_fail("match.signature",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxParser.cpp"
                ,0x6c7,"void Jinx::Impl::Parser::ParseFunctionCall(const FunctionMatch &)");
}

Assistant:

inline_t void Parser::ParseFunctionCall(const FunctionMatch & match)
	{
		assert(match.signature);

		auto libName = CheckLibraryName();
		if (!libName.empty())
			NextSymbol();

		// Parse function components according to match data
		for (size_t i = 0; i < match.partData.size(); ++i)
		{
			if (std::get<0>(match.partData[i]) == FunctionSignaturePartType::Name)
			{
				// Check to make sure this isn't a skipped optional name part
				if (std::get<1>(match.partData[i]) != 0)
					NextSymbol();
			}
			else
			{
				if (Accept(SymbolType::ParenOpen))
				{
					ParseExpression();
					Expect(SymbolType::ParenClose, "Error parsing expression");
				}
				else
				{
					auto expressionSize = std::get<1>(match.partData[i]);
					auto endSymbol = m_currentSymbol;
					for (size_t j = 0; j < expressionSize && endSymbol != m_symbolList.end(); ++j)
						++endSymbol;
					ParseExpression(endSymbol);
				}
			}
		}

		// When finished validating the function and pushing parameters, call the function
		EmitOpcode(Opcode::CallFunc);
		EmitId(match.signature->GetId());
		m_idNameMap[match.signature->GetId()] = match.signature->GetName();

		// Check for post-function index operator
		ParseSubscriptGet();
	}